

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

char * __thiscall cmGeneratorTarget::GetCustomObjectExtension(cmGeneratorTarget *this)

{
  cmMakefile *this_00;
  bool bVar1;
  int iVar2;
  string *psVar3;
  ulong uVar4;
  const_iterator pvVar5;
  char *pcVar6;
  bool has_extension;
  value_type *m;
  const_iterator __end2;
  const_iterator __begin2;
  array<compiler_mode,_4UL> *__range2;
  string local_68;
  string *local_48;
  string *compiler;
  allocator<char> local_38;
  allocator<char> local_37;
  undefined1 local_36;
  allocator<char> local_35 [20];
  allocator<char> local_21;
  array<compiler_mode,_4UL> *local_20;
  cmGeneratorTarget *local_18;
  cmGeneratorTarget *this_local;
  
  local_18 = this;
  if ((GetCustomObjectExtension()::modes == '\0') &&
     (iVar2 = __cxa_guard_acquire(&GetCustomObjectExtension()::modes), iVar2 != 0)) {
    compiler._0_1_ = 1;
    local_20 = &GetCustomObjectExtension::modes;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&GetCustomObjectExtension::modes,"CUDA_PTX_COMPILATION",&local_21);
    local_36 = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&GetCustomObjectExtension::modes._M_elems[0].extension,".ptx",local_35);
    local_36 = 0;
    local_20 = (array<compiler_mode,_4UL> *)0x16a1f40;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(GetCustomObjectExtension::modes._M_elems + 1),"CUDA_CUBIN_COMPILATION",
               &local_37);
    compiler._7_1_ = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&GetCustomObjectExtension::modes._M_elems[1].extension,".cubin",&local_38);
    compiler._7_1_ = 0;
    local_20 = (array<compiler_mode,_4UL> *)0x16a1f80;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(GetCustomObjectExtension::modes._M_elems + 2),"CUDA_FATBIN_COMPILATION",
               (allocator<char> *)((long)&compiler + 6));
    compiler._4_1_ = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&GetCustomObjectExtension::modes._M_elems[2].extension,".fatbin",
               (allocator<char> *)((long)&compiler + 5));
    compiler._4_1_ = 0;
    local_20 = (array<compiler_mode,_4UL> *)0x16a1fc0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(GetCustomObjectExtension::modes._M_elems + 3),"CUDA_OPTIX_COMPILATION",
               (allocator<char> *)((long)&compiler + 3));
    compiler._1_1_ = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&GetCustomObjectExtension::modes._M_elems[3].extension,".optixir",
               (allocator<char> *)((long)&compiler + 2));
    compiler._1_1_ = 0;
    compiler._0_1_ = 0;
    std::allocator<char>::~allocator((allocator<char> *)((long)&compiler + 2));
    std::allocator<char>::~allocator((allocator<char> *)((long)&compiler + 3));
    std::allocator<char>::~allocator((allocator<char> *)((long)&compiler + 5));
    std::allocator<char>::~allocator((allocator<char> *)((long)&compiler + 6));
    std::allocator<char>::~allocator(&local_38);
    std::allocator<char>::~allocator(&local_37);
    std::allocator<char>::~allocator(local_35);
    std::allocator<char>::~allocator(&local_21);
    __cxa_atexit(std::array<compiler_mode,_4UL>::~array,&GetCustomObjectExtension::modes,
                 &__dso_handle);
    __cxa_guard_release(&GetCustomObjectExtension()::modes);
  }
  this_00 = this->Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"CMAKE_CUDA_COMPILER_ID",(allocator<char> *)((long)&__range2 + 7));
  psVar3 = cmMakefile::GetSafeDefinition(this_00,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator((allocator<char> *)((long)&__range2 + 7));
  local_48 = psVar3;
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    __end2 = std::array<compiler_mode,_4UL>::begin(&GetCustomObjectExtension::modes);
    pvVar5 = std::array<compiler_mode,_4UL>::end(&GetCustomObjectExtension::modes);
    for (; __end2 != pvVar5; __end2 = __end2 + 1) {
      bVar1 = GetPropertyAsBool(this,&__end2->variable);
      if (bVar1) {
        pcVar6 = (char *)std::__cxx11::string::c_str();
        return pcVar6;
      }
    }
  }
  return (char *)0x0;
}

Assistant:

const char* cmGeneratorTarget::GetCustomObjectExtension() const
{
  struct compiler_mode
  {
    std::string variable;
    std::string extension;
  };
  static std::array<compiler_mode, 4> const modes{
    { { "CUDA_PTX_COMPILATION", ".ptx" },
      { "CUDA_CUBIN_COMPILATION", ".cubin" },
      { "CUDA_FATBIN_COMPILATION", ".fatbin" },
      { "CUDA_OPTIX_COMPILATION", ".optixir" } }
  };

  std::string const& compiler =
    this->Makefile->GetSafeDefinition("CMAKE_CUDA_COMPILER_ID");
  if (!compiler.empty()) {
    for (const auto& m : modes) {
      const bool has_extension = this->GetPropertyAsBool(m.variable);
      if (has_extension) {
        return m.extension.c_str();
      }
    }
  }
  return nullptr;
}